

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O2

void pack_16_pixels(__m256i *s0,__m256i *s1,__m256i *x)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i alVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  auVar11 = _DAT_0046a720;
  auVar10 = _DAT_0046a700;
  alVar1 = *s0;
  auVar7 = vpermq_avx2((undefined1  [32])alVar1,0x99);
  auVar2 = vpshufb_avx2((undefined1  [32])alVar1,_DAT_0046a700);
  auVar3 = vpshufb_avx2((undefined1  [32])alVar1,_DAT_0046a720);
  alVar1 = *s1;
  auVar8 = vpermq_avx2((undefined1  [32])alVar1,0x99);
  auVar4 = vpshufb_avx2((undefined1  [32])alVar1,_DAT_0046a700);
  auVar5 = vpshufb_avx2((undefined1  [32])alVar1,_DAT_0046a720);
  auVar9 = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar4._0_16_;
  alVar1[2] = auVar9._0_8_;
  alVar1._0_16_ = ZEXT116(0) * auVar4._0_16_ + ZEXT116(1) * auVar2._0_16_;
  alVar1[3] = auVar9._8_8_;
  *x = alVar1;
  auVar9 = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * auVar5._0_16_;
  alVar6[2] = auVar9._0_8_;
  alVar6._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar3._0_16_;
  alVar6[3] = auVar9._8_8_;
  x[1] = alVar6;
  auVar12._0_16_ = ZEXT116(0) * auVar8._0_16_ + ZEXT116(1) * auVar7._0_16_;
  auVar12._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar8._0_16_;
  alVar1 = (__m256i)vpshufb_avx2(auVar12,auVar10);
  x[2] = alVar1;
  alVar6 = (__m256i)vpshufb_avx2(auVar12,auVar11);
  x[3] = alVar6;
  x[4] = alVar1;
  x[5] = alVar6;
  alVar1 = (__m256i)vperm2i128_avx2(auVar2,auVar4,0x31);
  x[6] = alVar1;
  alVar1 = (__m256i)vperm2i128_avx2(auVar3,auVar5,0x31);
  x[7] = alVar1;
  return;
}

Assistant:

static inline void pack_16_pixels(const __m256i *s0, const __m256i *s1,
                                  __m256i *x /*x[8]*/) {
  __m256i pp[8];
  pack_pixels(s0, pp);
  pack_pixels(s1, &pp[4]);
  x[0] = _mm256_permute2x128_si256(pp[0], pp[4], 0x20);
  x[1] = _mm256_permute2x128_si256(pp[1], pp[5], 0x20);
  x[2] = _mm256_permute2x128_si256(pp[2], pp[6], 0x20);
  x[3] = _mm256_permute2x128_si256(pp[3], pp[7], 0x20);
  x[4] = x[2];
  x[5] = x[3];
  x[6] = _mm256_permute2x128_si256(pp[0], pp[4], 0x31);
  x[7] = _mm256_permute2x128_si256(pp[1], pp[5], 0x31);
}